

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::
validateNeuralNetwork<CoreML::Specification::NeuralNetworkRegressor>
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkRegressor *nn)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t uVar3;
  Rep *pRVar4;
  NeuralNetworkLayer *layer;
  Tensor *pTVar5;
  key_type *pkVar6;
  _Base_ptr p_Var7;
  pointer pcVar8;
  NeuralNetworkSpecValidator *pNVar9;
  bool bVar10;
  long lVar11;
  Type *pTVar12;
  iterator iVar13;
  uint32_t *puVar14;
  iterator iVar15;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  mapped_type *pmVar16;
  long *plVar17;
  undefined8 *puVar18;
  void **ppvVar19;
  ulong *puVar20;
  size_type *psVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  string err;
  string err_7;
  Result r;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [24];
  string local_188;
  Result *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  ulong *local_140;
  long local_138;
  ulong local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  size_type *local_100;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_b0;
  void **local_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  NeuralNetworkSpecValidator *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  void **local_60;
  void **local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_168 = __return_storage_ptr__;
  Result::Result((Result *)&local_100);
  pRVar4 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  ppvVar19 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar19 = (void **)0x0;
  }
  lVar11 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar11 != 0) {
    local_60 = ppvVar19 + lVar11;
    local_b0 = &this->ModelIOBlobNameToRank;
    local_70 = &(this->ModelIOBlobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8 = &this->blobNameToRank;
    local_78 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_00 = &this->blobs;
    local_68 = &(this->blobs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_80 = this;
    do {
      pNVar9 = local_80;
      layer = (NeuralNetworkLayer *)*ppvVar19;
      local_58 = ppvVar19;
      bVar10 = Result::good((Result *)&local_100);
      if (!bVar10) {
LAB_0030287b:
        *(size_type **)local_168 = local_100;
        paVar2 = &(local_168->m_message).field_2;
        (local_168->m_message)._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p == &local_e8) {
          paVar2->_M_allocated_capacity =
               CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
          *(undefined8 *)((long)&(local_168->m_message).field_2 + 8) = local_e8._8_8_;
        }
        else {
          (local_168->m_message)._M_dataplus._M_p = local_f8._M_p;
          (local_168->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
        }
        (local_168->m_message)._M_string_length = local_f0;
        local_f0 = 0;
        local_e8._M_local_buf[0] = '\0';
        local_f8._M_p = (pointer)&local_e8;
        goto LAB_00303b62;
      }
      if (pNVar9->ndArrayInterpretation == true) {
        iVar23 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
        if ((long)iVar23 != 0) {
          if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == iVar23) {
            pRVar4 = (layer->inputtensor_).super_RepeatedPtrFieldBase.rep_;
            local_a8 = pRVar4->elements;
            if (pRVar4 == (Rep *)0x0) {
              local_a8 = (void **)0x0;
            }
            pRVar1 = &layer->input_;
            lVar11 = (long)iVar23 << 3;
            lVar24 = 0;
            do {
              pTVar5 = (Tensor *)local_a8[lVar24];
              validateTensorMessage((Result *)local_1b0,pTVar5,layer);
              local_100 = (size_type *)local_1b0;
              std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a8);
              if (local_1a8._M_p != local_1a0 + 8) {
                operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
              }
              bVar10 = Result::good((Result *)&local_100);
              if (!bVar10) goto LAB_0030287b;
              iVar23 = (int)lVar24;
              pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::find(&local_b0->_M_t,pTVar12);
              if (iVar13._M_node != local_70) {
                uVar3 = pTVar5->rank_;
                pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                    (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
                puVar14 = (uint32_t *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[](local_b0,pTVar12);
                if (uVar3 != *puVar14) {
                  plVar17 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                  lVar11 = *plVar17;
                  local_140 = &local_130;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_140,lVar11,plVar17[1] + lVar11);
                  puVar18 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x3bf2be);
                  plVar17 = puVar18 + 2;
                  if ((long *)*puVar18 == plVar17) {
                    local_110 = *plVar17;
                    uStack_108 = puVar18[3];
                    local_120 = &local_110;
                  }
                  else {
                    local_110 = *plVar17;
                    local_120 = (long *)*puVar18;
                  }
                  local_118 = puVar18[1];
                  *puVar18 = plVar17;
                  puVar18[1] = 0;
                  *(undefined1 *)(puVar18 + 2) = 0;
                  plVar17 = (long *)std::__cxx11::string::append((char *)&local_120);
                  puVar20 = (ulong *)(plVar17 + 2);
                  if ((ulong *)*plVar17 == puVar20) {
                    local_150 = *puVar20;
                    lStack_148 = plVar17[3];
                    local_160 = &local_150;
                  }
                  else {
                    local_150 = *puVar20;
                    local_160 = (ulong *)*plVar17;
                  }
                  local_158 = plVar17[1];
                  *plVar17 = (long)puVar20;
                  plVar17[1] = 0;
                  *(undefined1 *)(plVar17 + 2) = 0;
                  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                      (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
                  pcVar8 = (pTVar12->_M_dataplus)._M_p;
                  local_d0 = &local_c0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_d0,pcVar8,pcVar8 + pTVar12->_M_string_length);
                  uVar22 = 0xf;
                  if (local_160 != &local_150) {
                    uVar22 = local_150;
                  }
                  if (uVar22 < (ulong)(local_c8 + local_158)) {
                    uVar22 = 0xf;
                    if (local_d0 != &local_c0) {
                      uVar22 = local_c0;
                    }
                    if (uVar22 < (ulong)(local_c8 + local_158)) goto LAB_003032e1;
                    puVar18 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_d0,0,(char *)0x0,(ulong)local_160);
                  }
                  else {
LAB_003032e1:
                    puVar18 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_d0);
                  }
                  local_1d0 = &local_1c0;
                  puVar20 = puVar18 + 2;
                  if ((ulong *)*puVar18 == puVar20) {
                    local_1c0 = *puVar20;
                    uStack_1b8 = puVar18[3];
                  }
                  else {
                    local_1c0 = *puVar20;
                    local_1d0 = (ulong *)*puVar18;
                  }
                  local_1c8 = puVar18[1];
                  *puVar18 = puVar20;
                  puVar18[1] = 0;
                  *(undefined1 *)puVar20 = 0;
                  puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
                  psVar21 = puVar18 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar18 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar21) {
                    local_188.field_2._M_allocated_capacity = *psVar21;
                    local_188.field_2._8_8_ = puVar18[3];
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                  }
                  else {
                    local_188.field_2._M_allocated_capacity = *psVar21;
                    local_188._M_dataplus._M_p = (pointer)*puVar18;
                  }
                  local_188._M_string_length = puVar18[1];
                  *puVar18 = psVar21;
                  puVar18[1] = 0;
                  *(undefined1 *)(puVar18 + 2) = 0;
                  puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
                  local_1b0 = (undefined1  [8])local_1a0;
                  psVar21 = puVar18 + 2;
                  if ((size_type *)*puVar18 == psVar21) {
                    local_1a0._0_8_ = *psVar21;
                    local_1a0._8_8_ = puVar18[3];
                  }
                  else {
                    local_1a0._0_8_ = *psVar21;
                    local_1b0 = (undefined1  [8])*puVar18;
                  }
                  local_1a8._M_p = (pointer)puVar18[1];
                  *puVar18 = psVar21;
                  puVar18[1] = 0;
                  *(undefined1 *)(puVar18 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1d0 != &local_1c0) {
                    operator_delete(local_1d0,local_1c0 + 1);
                  }
                  if (local_d0 != &local_c0) {
                    operator_delete(local_d0,local_c0 + 1);
                  }
                  if (local_160 != &local_150) {
                    operator_delete(local_160,local_150 + 1);
                  }
                  if (local_120 != &local_110) {
                    operator_delete(local_120,local_110 + 1);
                  }
                  if (local_140 != &local_130) {
                    operator_delete(local_140,local_130 + 1);
                  }
                  Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                  goto LAB_00303b4b;
                }
              }
              pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::find(&local_d8->_M_t,pTVar12);
              if (iVar13._M_node == local_78) {
                uVar3 = pTVar5->rank_;
                pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                    (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
                puVar14 = (uint32_t *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[](local_d8,pTVar12);
                *puVar14 = uVar3;
              }
              else {
                pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                    (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
                puVar14 = (uint32_t *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[](local_d8,pTVar12);
                if (*puVar14 != pTVar5->rank_) {
                  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                      (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
                  pcVar8 = (pTVar12->_M_dataplus)._M_p;
                  local_1d0 = &local_1c0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1d0,pcVar8,pcVar8 + pTVar12->_M_string_length);
                  puVar18 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x3b9feb);
                  psVar21 = puVar18 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar18 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar21) {
                    local_188.field_2._M_allocated_capacity = *psVar21;
                    local_188.field_2._8_8_ = puVar18[3];
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                  }
                  else {
                    local_188.field_2._M_allocated_capacity = *psVar21;
                    local_188._M_dataplus._M_p = (pointer)*puVar18;
                  }
                  local_188._M_string_length = puVar18[1];
                  *puVar18 = psVar21;
                  puVar18[1] = 0;
                  *(undefined1 *)(puVar18 + 2) = 0;
                  puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
                  local_1b0 = (undefined1  [8])local_1a0;
                  psVar21 = puVar18 + 2;
                  if ((size_type *)*puVar18 == psVar21) {
                    local_1a0._0_8_ = *psVar21;
                    local_1a0._8_8_ = puVar18[3];
                  }
                  else {
                    local_1a0._0_8_ = *psVar21;
                    local_1b0 = (undefined1  [8])*puVar18;
                  }
                  local_1a8._M_p = (pointer)puVar18[1];
                  *puVar18 = psVar21;
                  puVar18[1] = 0;
                  *(undefined1 *)(puVar18 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1d0 != &local_1c0) {
                    operator_delete(local_1d0,local_1c0 + 1);
                  }
                  Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                  goto LAB_00303b4b;
                }
              }
              lVar24 = lVar24 + 1;
              lVar11 = lVar11 + -8;
            } while (lVar11 != 0);
            goto LAB_003025bc;
          }
          plVar17 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar11 = *plVar17;
          local_1d0 = &local_1c0;
          std::__cxx11::string::_M_construct<char*>((string *)&local_1d0,lVar11,plVar17[1] + lVar11)
          ;
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x3bf2be);
          psVar21 = puVar18 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar21) {
            local_188.field_2._M_allocated_capacity = *psVar21;
            local_188.field_2._8_8_ = puVar18[3];
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar21;
            local_188._M_dataplus._M_p = (pointer)*puVar18;
          }
          local_188._M_string_length = puVar18[1];
          *puVar18 = psVar21;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
          local_1b0 = (undefined1  [8])local_1a0;
          psVar21 = puVar18 + 2;
          if ((size_type *)*puVar18 == psVar21) {
            local_1a0._0_8_ = *psVar21;
            local_1a0._8_8_ = puVar18[3];
          }
          else {
            local_1a0._0_8_ = *psVar21;
            local_1b0 = (undefined1  [8])*puVar18;
          }
          local_1a8._M_p = (pointer)puVar18[1];
          *puVar18 = psVar21;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0,local_1c0 + 1);
          }
          Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
LAB_00303b4b:
          if (local_1b0 != (undefined1  [8])local_1a0) {
LAB_00303b55:
            operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
          }
          goto LAB_00303b62;
        }
LAB_003025bc:
        iVar23 = (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
        if ((long)iVar23 != 0) {
          if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ != iVar23) {
            plVar17 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            lVar11 = *plVar17;
            local_1d0 = &local_1c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d0,lVar11,plVar17[1] + lVar11);
            puVar18 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x3bf2be);
            psVar21 = puVar18 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar21) {
              local_188.field_2._M_allocated_capacity = *psVar21;
              local_188.field_2._8_8_ = puVar18[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar21;
              local_188._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_188._M_string_length = puVar18[1];
            *puVar18 = psVar21;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
            local_1b0 = (undefined1  [8])local_1a0;
            psVar21 = puVar18 + 2;
            if ((size_type *)*puVar18 == psVar21) {
              local_1a0._0_8_ = *psVar21;
              local_1a0._8_8_ = puVar18[3];
            }
            else {
              local_1a0._0_8_ = *psVar21;
              local_1b0 = (undefined1  [8])*puVar18;
            }
            local_1a8._M_p = (pointer)puVar18[1];
            *puVar18 = psVar21;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0,local_1c0 + 1);
            }
            Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
            goto LAB_00303b4b;
          }
          pRVar4 = (layer->outputtensor_).super_RepeatedPtrFieldBase.rep_;
          local_a8 = pRVar4->elements;
          if (pRVar4 == (Rep *)0x0) {
            local_a8 = (void **)0x0;
          }
          pRVar1 = &layer->output_;
          lVar11 = (long)iVar23 << 3;
          lVar24 = 0;
          do {
            pTVar5 = (Tensor *)local_a8[lVar24];
            validateTensorMessage((Result *)local_1b0,pTVar5,layer);
            local_100 = (size_type *)local_1b0;
            std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a8);
            if (local_1a8._M_p != local_1a0 + 8) {
              operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
            }
            bVar10 = Result::good((Result *)&local_100);
            if (!bVar10) goto LAB_0030287b;
            iVar23 = (int)lVar24;
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
            iVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&local_b0->_M_t,pTVar12);
            if (iVar13._M_node != local_70) {
              uVar3 = pTVar5->rank_;
              pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
              puVar14 = (uint32_t *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](local_b0,pTVar12);
              if (uVar3 != *puVar14) {
                plVar17 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                lVar11 = *plVar17;
                local_140 = &local_130;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_140,lVar11,plVar17[1] + lVar11);
                puVar18 = (undefined8 *)
                          std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x3bf2be);
                plVar17 = puVar18 + 2;
                if ((long *)*puVar18 == plVar17) {
                  local_110 = *plVar17;
                  uStack_108 = puVar18[3];
                  local_120 = &local_110;
                }
                else {
                  local_110 = *plVar17;
                  local_120 = (long *)*puVar18;
                }
                local_118 = puVar18[1];
                *puVar18 = plVar17;
                puVar18[1] = 0;
                *(undefined1 *)(puVar18 + 2) = 0;
                plVar17 = (long *)std::__cxx11::string::append((char *)&local_120);
                puVar20 = (ulong *)(plVar17 + 2);
                if ((ulong *)*plVar17 == puVar20) {
                  local_150 = *puVar20;
                  lStack_148 = plVar17[3];
                  local_160 = &local_150;
                }
                else {
                  local_150 = *puVar20;
                  local_160 = (ulong *)*plVar17;
                }
                local_158 = plVar17[1];
                *plVar17 = (long)puVar20;
                plVar17[1] = 0;
                *(undefined1 *)(plVar17 + 2) = 0;
                pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                    (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
                pcVar8 = (pTVar12->_M_dataplus)._M_p;
                local_d0 = &local_c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d0,pcVar8,pcVar8 + pTVar12->_M_string_length);
                uVar22 = 0xf;
                if (local_160 != &local_150) {
                  uVar22 = local_150;
                }
                if (uVar22 < (ulong)(local_c8 + local_158)) {
                  uVar22 = 0xf;
                  if (local_d0 != &local_c0) {
                    uVar22 = local_c0;
                  }
                  if (uVar22 < (ulong)(local_c8 + local_158)) goto LAB_00303670;
                  puVar18 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_d0,0,(char *)0x0,(ulong)local_160);
                }
                else {
LAB_00303670:
                  puVar18 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_d0);
                }
                local_1d0 = &local_1c0;
                puVar20 = puVar18 + 2;
                if ((ulong *)*puVar18 == puVar20) {
                  local_1c0 = *puVar20;
                  uStack_1b8 = puVar18[3];
                }
                else {
                  local_1c0 = *puVar20;
                  local_1d0 = (ulong *)*puVar18;
                }
                local_1c8 = puVar18[1];
                *puVar18 = puVar20;
                puVar18[1] = 0;
                *(undefined1 *)puVar20 = 0;
                puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
                psVar21 = puVar18 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar18 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar21) {
                  local_188.field_2._M_allocated_capacity = *psVar21;
                  local_188.field_2._8_8_ = puVar18[3];
                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                }
                else {
                  local_188.field_2._M_allocated_capacity = *psVar21;
                  local_188._M_dataplus._M_p = (pointer)*puVar18;
                }
                local_188._M_string_length = puVar18[1];
                *puVar18 = psVar21;
                puVar18[1] = 0;
                *(undefined1 *)(puVar18 + 2) = 0;
                puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
                local_1b0 = (undefined1  [8])local_1a0;
                psVar21 = puVar18 + 2;
                if ((size_type *)*puVar18 == psVar21) {
                  local_1a0._0_8_ = *psVar21;
                  local_1a0._8_8_ = puVar18[3];
                }
                else {
                  local_1a0._0_8_ = *psVar21;
                  local_1b0 = (undefined1  [8])*puVar18;
                }
                local_1a8._M_p = (pointer)puVar18[1];
                *puVar18 = psVar21;
                puVar18[1] = 0;
                *(undefined1 *)(puVar18 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
                if (local_1d0 != &local_1c0) {
                  operator_delete(local_1d0,local_1c0 + 1);
                }
                if (local_d0 != &local_c0) {
                  operator_delete(local_d0,local_c0 + 1);
                }
                if (local_160 != &local_150) {
                  operator_delete(local_160,local_150 + 1);
                }
                if (local_120 != &local_110) {
                  operator_delete(local_120,local_110 + 1);
                }
                if (local_140 != &local_130) {
                  operator_delete(local_140,local_130 + 1);
                }
                Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                goto LAB_00303b4b;
              }
            }
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
            iVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&local_d8->_M_t,pTVar12);
            if (iVar13._M_node == local_78) {
              uVar3 = pTVar5->rank_;
              pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
              puVar14 = (uint32_t *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](local_d8,pTVar12);
              *puVar14 = uVar3;
            }
            else {
              pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                  (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
              puVar14 = (uint32_t *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](local_d8,pTVar12);
              if (*puVar14 != pTVar5->rank_) {
                pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                    (&pRVar1->super_RepeatedPtrFieldBase,iVar23);
                pcVar8 = (pTVar12->_M_dataplus)._M_p;
                local_1d0 = &local_1c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1d0,pcVar8,pcVar8 + pTVar12->_M_string_length);
                puVar18 = (undefined8 *)
                          std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x3b9feb);
                psVar21 = puVar18 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar18 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar21) {
                  local_188.field_2._M_allocated_capacity = *psVar21;
                  local_188.field_2._8_8_ = puVar18[3];
                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                }
                else {
                  local_188.field_2._M_allocated_capacity = *psVar21;
                  local_188._M_dataplus._M_p = (pointer)*puVar18;
                }
                local_188._M_string_length = puVar18[1];
                *puVar18 = psVar21;
                puVar18[1] = 0;
                *(undefined1 *)(puVar18 + 2) = 0;
                puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
                local_1b0 = (undefined1  [8])local_1a0;
                psVar21 = puVar18 + 2;
                if ((size_type *)*puVar18 == psVar21) {
                  local_1a0._0_8_ = *psVar21;
                  local_1a0._8_8_ = puVar18[3];
                }
                else {
                  local_1a0._0_8_ = *psVar21;
                  local_1b0 = (undefined1  [8])*puVar18;
                }
                local_1a8._M_p = (pointer)puVar18[1];
                *puVar18 = psVar21;
                puVar18[1] = 0;
                *(undefined1 *)(puVar18 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
                if (local_1d0 != &local_1c0) {
                  operator_delete(local_1d0,local_1c0 + 1);
                }
                Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                goto LAB_00303b4b;
              }
            }
            lVar24 = lVar24 + 1;
            lVar11 = lVar11 + -8;
          } while (lVar11 != 0);
        }
      }
      validateLayer((Result *)local_1b0,local_80,layer);
      local_100 = (size_type *)local_1b0;
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a8);
      if (local_1a8._M_p != local_1a0 + 8) {
        operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
      }
      bVar10 = Result::good((Result *)&local_100);
      if (!bVar10) goto LAB_0030287b;
      pRVar4 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar19 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar19 = (void **)0x0;
      }
      lVar11 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar11 != 0) {
        lVar24 = 0;
        do {
          pkVar6 = *(key_type **)((long)ppvVar19 + lVar24);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find(&this_00->_M_t,pkVar6);
          if (iVar15._M_node == local_68) {
            plVar17 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            lVar11 = *plVar17;
            local_120 = &local_110;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,lVar11,plVar17[1] + lVar11);
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_120,0,(char *)0x0,0x3bf2be);
            puVar20 = (ulong *)(plVar17 + 2);
            if ((ulong *)*plVar17 == puVar20) {
              local_150 = *puVar20;
              lStack_148 = plVar17[3];
              local_160 = &local_150;
            }
            else {
              local_150 = *puVar20;
              local_160 = (ulong *)*plVar17;
            }
            local_158 = plVar17[1];
            *plVar17 = (long)puVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
            puVar20 = puVar18 + 2;
            if ((ulong *)*puVar18 == puVar20) {
              local_1c0 = *puVar20;
              uStack_1b8 = puVar18[3];
              local_1d0 = &local_1c0;
            }
            else {
              local_1c0 = *puVar20;
              local_1d0 = (ulong *)*puVar18;
            }
            local_1c8 = puVar18[1];
            *puVar18 = puVar20;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            pcVar8 = (pkVar6->_M_dataplus)._M_p;
            local_140 = &local_130;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,pcVar8,pcVar8 + pkVar6->_M_string_length);
            uVar22 = 0xf;
            if (local_1d0 != &local_1c0) {
              uVar22 = local_1c0;
            }
            if (uVar22 < (ulong)(local_138 + local_1c8)) {
              uVar22 = 0xf;
              if (local_140 != &local_130) {
                uVar22 = local_130;
              }
              if (uVar22 < (ulong)(local_138 + local_1c8)) goto LAB_00302afd;
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_140,0,(char *)0x0,(ulong)local_1d0);
            }
            else {
LAB_00302afd:
              puVar18 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_140);
            }
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            psVar21 = puVar18 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar21) {
              local_188.field_2._M_allocated_capacity = *psVar21;
              local_188.field_2._8_8_ = puVar18[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar21;
              local_188._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_188._M_string_length = puVar18[1];
            *puVar18 = psVar21;
            puVar18[1] = 0;
            *(undefined1 *)psVar21 = 0;
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_1b0 = (undefined1  [8])local_1a0;
            psVar21 = (size_type *)(plVar17 + 2);
            if ((size_type *)*plVar17 == psVar21) {
              local_1a0._0_8_ = *psVar21;
              local_1a0._8_8_ = plVar17[3];
            }
            else {
              local_1a0._0_8_ = *psVar21;
              local_1b0 = (undefined1  [8])*plVar17;
            }
            local_1a8._M_p = (pointer)plVar17[1];
            *plVar17 = (long)psVar21;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_140 != &local_130) {
              operator_delete(local_140,local_130 + 1);
            }
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0,local_1c0 + 1);
            }
            if (local_160 != &local_150) {
              operator_delete(local_160,local_150 + 1);
            }
            if (local_120 != &local_110) {
              operator_delete(local_120,local_110 + 1);
            }
            Result::Result(local_168,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
            goto LAB_00303b4b;
          }
          lVar24 = lVar24 + 8;
        } while (lVar11 * 8 != lVar24);
      }
      pRVar4 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar19 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar19 = (void **)0x0;
      }
      lVar11 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar11 != 0) {
        lVar24 = 0;
        do {
          pkVar6 = *(key_type **)((long)ppvVar19 + lVar24);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find(&this_00->_M_t,pkVar6);
          if ((iVar15._M_node != local_68) && (layer->_oneof_case_[0] != 600)) {
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](this_00,pkVar6);
            p_Var7 = (pmVar16->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            local_1b0 = (undefined1  [8])local_1a0;
            lVar11 = *(long *)(p_Var7 + 1);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1b0,lVar11,(long)&(p_Var7[1]._M_parent)->_M_color + lVar11);
            plVar17 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            lVar11 = *plVar17;
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char*>((string *)local_50,lVar11,plVar17[1] + lVar11)
            ;
            plVar17 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3bf2be);
            puVar20 = (ulong *)(plVar17 + 2);
            if ((ulong *)*plVar17 == puVar20) {
              local_c0 = *puVar20;
              lStack_b8 = plVar17[3];
              local_d0 = &local_c0;
            }
            else {
              local_c0 = *puVar20;
              local_d0 = (ulong *)*plVar17;
            }
            local_c8 = plVar17[1];
            *plVar17 = (long)puVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_d0);
            puVar20 = (ulong *)(plVar17 + 2);
            if ((ulong *)*plVar17 == puVar20) {
              local_130 = *puVar20;
              uStack_128 = (undefined4)plVar17[3];
              uStack_124 = *(undefined4 *)((long)plVar17 + 0x1c);
              local_140 = &local_130;
            }
            else {
              local_130 = *puVar20;
              local_140 = (ulong *)*plVar17;
            }
            local_138 = plVar17[1];
            *plVar17 = (long)puVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            local_a0 = local_90;
            pcVar8 = (pkVar6->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar8,pcVar8 + pkVar6->_M_string_length);
            uVar22 = 0xf;
            if (local_140 != &local_130) {
              uVar22 = local_130;
            }
            if (uVar22 < (ulong)(local_98 + local_138)) {
              uVar22 = 0xf;
              if (local_a0 != local_90) {
                uVar22 = local_90[0];
              }
              if (uVar22 < (ulong)(local_98 + local_138)) goto LAB_00302e55;
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_a0,0,(char *)0x0,(ulong)local_140);
            }
            else {
LAB_00302e55:
              puVar18 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0);
            }
            local_120 = &local_110;
            plVar17 = puVar18 + 2;
            if ((long *)*puVar18 == plVar17) {
              local_110 = *plVar17;
              uStack_108 = puVar18[3];
            }
            else {
              local_110 = *plVar17;
              local_120 = (long *)*puVar18;
            }
            local_118 = puVar18[1];
            *puVar18 = plVar17;
            puVar18[1] = 0;
            *(undefined1 *)plVar17 = 0;
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_120);
            puVar20 = (ulong *)(plVar17 + 2);
            if ((ulong *)*plVar17 == puVar20) {
              local_150 = *puVar20;
              lStack_148 = plVar17[3];
              local_160 = &local_150;
            }
            else {
              local_150 = *puVar20;
              local_160 = (ulong *)*plVar17;
            }
            local_158 = plVar17[1];
            *plVar17 = (long)puVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            puVar18 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1b0);
            puVar20 = puVar18 + 2;
            if ((ulong *)*puVar18 == puVar20) {
              local_1c0 = *puVar20;
              uStack_1b8 = puVar18[3];
              local_1d0 = &local_1c0;
            }
            else {
              local_1c0 = *puVar20;
              local_1d0 = (ulong *)*puVar18;
            }
            local_1c8 = puVar18[1];
            *puVar18 = puVar20;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
            psVar21 = puVar18 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar21) {
              local_188.field_2._M_allocated_capacity = *psVar21;
              local_188.field_2._8_8_ = puVar18[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar21;
              local_188._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_188._M_string_length = puVar18[1];
            *puVar18 = psVar21;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            if (local_1d0 != &local_1c0) {
              operator_delete(local_1d0,local_1c0 + 1);
            }
            if (local_160 != &local_150) {
              operator_delete(local_160,local_150 + 1);
            }
            if (local_120 != &local_110) {
              operator_delete(local_120,local_110 + 1);
            }
            if (local_a0 != local_90) {
              operator_delete(local_a0,local_90[0] + 1);
            }
            if (local_140 != &local_130) {
              operator_delete(local_140,local_130 + 1);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            Result::Result(local_168,INVALID_MODEL_PARAMETERS,&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1b0 == (undefined1  [8])local_1a0) goto LAB_00303b62;
            goto LAB_00303b55;
          }
          this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ::operator[](this_00,pkVar6);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          lVar24 = lVar24 + 8;
        } while (lVar11 * 8 != lVar24);
      }
      ppvVar19 = local_58 + 1;
    } while (ppvVar19 != local_60);
  }
  Result::Result(local_168);
LAB_00303b62:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,
                    CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
  }
  return local_168;
}

Assistant:

Result NeuralNetworkSpecValidator::validateNeuralNetwork(const T& nn) {

    Result r;

    // Loop over the layers
    // For each layer, validate the following:
    // 1. inputtensor/outputtensor message, rank compatibilty with Model input/output ranks
    // 2. Check rank consistency across the network for all blobs: ranks are not allowed to change for the same blob
    // 3. Call layer specific validation function
    // 4. check that layer's inputs are already present in "availableBlobs" set
    // 5. check that layer's outputs are NOT already present in "availableBlobs" set
    // 6. Add the layer's outputs to the "availableBlobs" set
    for (const auto& layer : nn.layers()) {

        if (!r.good()) {
            return r;
        }

        // check for inputtensor message validity
        if (ndArrayInterpretation) {
            if (layer.inputtensor_size() != 0) {
                if (layer.input_size() != layer.inputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s input and inputTensors have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.inputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.input(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.input(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s input '" + std::string(layer.input(idx)) + \
                            "' is also an input to the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.input(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.input(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.input(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.input(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
            if (layer.outputtensor_size() != 0) {
                if (layer.output_size() != layer.outputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s output and \"outputTensors\" property have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.outputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.output(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.output(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s output '" + std::string(layer.output(idx)) + \
                            "' is also an output of the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.output(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.output(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.output(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.output(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
        } // inputtensor, outputtensor validity end

        // First, we check the layer for internal correctness
        // this calls layer wise function
        r = validateLayer(layer);

        if (!r.good()) {
            return r;
        }

        // Check for topological defects: the layer's input must have been produced by a blob we have
        // already seen.
        for (const auto& input: layer.input()) {
            if (blobs.find(input) == blobs.end()) {
                std::string err = "Layer '" + std::string(layer.name()) + "' consumes an input named '"
                + std::string(input) + "' which is not present in this network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }

        // Check for topological defects: check that the same output isn't being produced in two different places.
        // unless its the "copy" layer
        for (const auto& output: layer.output()) {
            if (blobs.find(output) != blobs.end()) {
                if (layer.layer_case() != Specification::NeuralNetworkLayer::LayerCase::kCopy) {
                    std::string layer_name = *(blobs[output].begin());
                    std::string err = "Layer '" + std::string(layer.name()) + "' produces an output named '"
                    + std::string(output) + "' which is also an output produced by the layer '"
                    + layer_name + "'.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
            blobs[output].insert(layer.name());
        }
    } // loop over layers

    return Result();
}